

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepInterface.h
# Opt level: O0

shared_ptr<Calculator> __thiscall
gurkenlaeufer::detail::ScenarioContext::getFixture<Calculator>(ScenarioContext *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>>>
  *in_RSI;
  shared_ptr<Calculator> sVar3;
  undefined1 local_50 [8];
  shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_> fixture;
  shared_ptr<gurkenlaeufer::detail::IFixture> *fixture_1;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
  *__range3;
  ScenarioContext *this_local;
  shared_ptr<Calculator> *ptr;
  
  __end3 = std::
           vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
           ::begin((vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
                    *)in_RSI);
  fixture_1 = (shared_ptr<gurkenlaeufer::detail::IFixture> *)
              std::
              vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
              ::end((vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
                     *)in_RSI);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_*,_std::vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>_>
                                     *)&fixture_1), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_*,_std::vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>_>
    ::operator*(&__end3);
    fixture.
    super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 0;
    std::dynamic_pointer_cast<Calculator,gurkenlaeufer::detail::IFixture>
              ((shared_ptr<gurkenlaeufer::detail::IFixture> *)this);
    fixture.
    super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_1_ = std::operator!=((shared_ptr<Calculator> *)this,(nullptr_t)0x0);
    if (fixture.
        super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_) {
      fixture.
      super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 1;
    }
    fixture.
    super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._1_3_ = 0;
    _Var2._M_pi = extraout_RDX;
    if ((fixture.
         super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) == 0) {
      std::shared_ptr<Calculator>::~shared_ptr((shared_ptr<Calculator> *)this);
      _Var2._M_pi = extraout_RDX_00;
    }
    if ((uint)fixture.
              super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != 0) goto LAB_002114b5;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_*,_std::vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>_>
    ::operator++(&__end3);
  }
  std::make_shared<gurkenlaeufer::detail::Fixture<Calculator>>();
  std::
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>>>
  ::emplace_back<std::shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>>&>
            (in_RSI,(shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_> *)local_50);
  std::shared_ptr<Calculator>::shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,void>
            ((shared_ptr<Calculator> *)this,
             (shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_> *)local_50);
  fixture.super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = 1;
  std::shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_>::~shared_ptr
            ((shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_> *)local_50);
  _Var2._M_pi = extraout_RDX_01;
LAB_002114b5:
  sVar3.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Calculator>)sVar3.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> getFixture()
        {
            for (auto& fixture : _fixtures) {
                auto ptr = std::dynamic_pointer_cast<T>(fixture);
                if (ptr != nullptr) {
                    return ptr;
                }
            }

            auto fixture = std::make_shared<Fixture<T>>();
            _fixtures.emplace_back(fixture);
            return fixture;
        }